

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluVarTypeUtil.hpp
# Opt level: O2

void __thiscall
glu::SubTypeIterator<glu::IsBasicType>::removeTraversed(SubTypeIterator<glu::IsBasicType> *this)

{
  pointer *ppVVar1;
  VarType *type;
  VarType *pVVar2;
  int iVar3;
  int iVar4;
  __normal_iterator<glu::VarTypeComponent_*,_std::vector<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>_>
  in_R8;
  VarType parentType;
  
  do {
    type = (VarType *)
           (this->m_path).
           super__Vector_base<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>._M_impl
           .super__Vector_impl_data._M_start;
    pVVar2 = (VarType *)
             (this->m_path).
             super__Vector_base<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if (type == pVVar2) {
      return;
    }
    getVarType<__gnu_cxx::__normal_iterator<glu::VarTypeComponent*,std::vector<glu::VarTypeComponent,std::allocator<glu::VarTypeComponent>>>>
              (&parentType,(glu *)this->m_type,type,
               (VarTypeComponent *)((long)&pVVar2[-1].m_data + 8),in_R8);
    switch(pVVar2[-1].m_data.array.size) {
    case 0:
      if (*(int *)((long)&pVVar2[-1].m_data + 0xc) + 1 <
          (int)((*(long *)(CONCAT44(parentType.m_data.basic.precision,parentType.m_data.basic.type)
                          + 0x28) -
                *(long *)(CONCAT44(parentType.m_data.basic.precision,parentType.m_data.basic.type) +
                         0x20)) / 0x38)) goto LAB_007173dc;
      break;
    case 1:
      if (*(int *)((long)&pVVar2[-1].m_data + 0xc) + 1 < parentType.m_data.array.size)
      goto LAB_007173dc;
      break;
    case 2:
      iVar4 = *(int *)((long)&pVVar2[-1].m_data + 0xc);
      iVar3 = getDataTypeMatrixNumColumns(parentType.m_data.basic.type);
      goto LAB_007173b6;
    case 3:
      iVar4 = *(int *)((long)&pVVar2[-1].m_data + 0xc);
      iVar3 = getDataTypeScalarSize(parentType.m_data.basic.type);
LAB_007173b6:
      if (iVar4 + 1 < iVar3) {
LAB_007173dc:
        VarType::~VarType(&parentType);
        return;
      }
    }
    ppVVar1 = &(this->m_path).
               super__Vector_base<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>.
               _M_impl.super__Vector_impl_data._M_finish;
    *ppVVar1 = *ppVVar1 + -1;
    VarType::~VarType(&parentType);
  } while( true );
}

Assistant:

void SubTypeIterator<IsExpanded>::removeTraversed (void)
{
	DE_ASSERT(m_type && !m_path.empty());

	// Pop traversed nodes.
	while (!m_path.empty())
	{
		VarTypeComponent&	curComp		= m_path.back();
		VarType				parentType	= getVarType(*m_type, m_path.begin(), m_path.end()-1);

		if (curComp.type == VarTypeComponent::MATRIX_COLUMN)
		{
			DE_ASSERT(isDataTypeMatrix(parentType.getBasicType()));
			if (curComp.index+1 < getDataTypeMatrixNumColumns(parentType.getBasicType()))
				break;
		}
		else if (curComp.type == VarTypeComponent::VECTOR_COMPONENT)
		{
			DE_ASSERT(isDataTypeVector(parentType.getBasicType()));
			if (curComp.index+1 < getDataTypeScalarSize(parentType.getBasicType()))
				break;
		}
		else if (curComp.type == VarTypeComponent::ARRAY_ELEMENT)
		{
			DE_ASSERT(parentType.isArrayType());
			if (curComp.index+1 < parentType.getArraySize())
				break;
		}
		else if (curComp.type == VarTypeComponent::STRUCT_MEMBER)
		{
			DE_ASSERT(parentType.isStructType());
			if (curComp.index+1 < parentType.getStructPtr()->getNumMembers())
				break;
		}

		m_path.pop_back();
	}
}